

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void ImGui::ShowDemoWindow(bool *p_open)

{
  char cVar1;
  ushort uVar2;
  double dVar3;
  ImVec2 IVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ImU32 IVar10;
  ImU32 IVar11;
  ImGuiMouseCursor IVar12;
  ImGuiContext *pIVar13;
  void *pvVar14;
  ImGuiIO *pIVar15;
  ImDrawList *pIVar16;
  ImGuiStyle *pIVar17;
  ulong uVar18;
  long lVar19;
  int obj_i;
  int iVar20;
  bool *pbVar21;
  int i;
  ImGuiWindowFlags flags;
  long lVar22;
  char *pcVar23;
  char *pcVar24;
  int iVar25;
  int i_13;
  int i_2;
  undefined8 *puVar26;
  MyDocument *doc;
  ulong uVar27;
  int n;
  uint uVar28;
  long lVar29;
  undefined **ppuVar30;
  float fVar31;
  float fVar32;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  ImVec2 p1;
  ImVec2 gradient_size;
  ImVec2 mouse_pos_in_canvas;
  char label [128];
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148 [2];
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  ImVec2 local_110;
  undefined1 local_108 [16];
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  ImVec2 IStack_d0;
  ImVec2 local_c8;
  ImVec2 IStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  bool *local_50;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar13 = GetCurrentContext();
  if (pIVar13 == (ImGuiContext *)0x0) {
    __assert_fail("ImGui::GetCurrentContext() != __null && \"Missing dear imgui context. Refer to examples app!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_demo.cpp"
                  ,0xf9,"void ImGui::ShowDemoWindow(bool *)");
  }
  if ((ShowDemoWindow::show_app_main_menu_bar == true) && (bVar6 = BeginMainMenuBar(), bVar6)) {
    bVar6 = BeginMenu("File",true);
    if (bVar6) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar6 = BeginMenu("Edit",true);
    if (bVar6) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_documents == true) {
    if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
       (iVar20 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar20 != 0)) {
      ExampleAppDocuments::ExampleAppDocuments
                ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
      __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
    }
    bVar6 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
    if (bVar6) {
      bVar6 = BeginMenuBar();
      if (bVar6) {
        bVar6 = BeginMenu("File",true);
        if (bVar6) {
          if ((long)ShowExampleAppDocuments(bool*)::app < 1) {
            iVar20 = 0;
          }
          else {
            lVar22 = 0;
            iVar20 = 0;
            do {
              iVar20 = iVar20 + (uint)*(byte *)(DAT_0022de58 + 8 + lVar22);
              lVar22 = lVar22 + 0x20;
            } while ((long)ShowExampleAppDocuments(bool*)::app << 5 != lVar22);
          }
          bVar6 = BeginMenu("Open",iVar20 < ShowExampleAppDocuments(bool*)::app);
          if (bVar6) {
            if (0 < ShowExampleAppDocuments(bool*)::app) {
              lVar22 = 8;
              lVar29 = 0;
              do {
                lVar19 = DAT_0022de58;
                if ((*(char *)(DAT_0022de58 + lVar22) == '\0') &&
                   (bVar6 = MenuItem(*(char **)(DAT_0022de58 + -8 + lVar22),(char *)0x0,false,true),
                   bVar6)) {
                  *(undefined1 *)(lVar19 + lVar22) = 1;
                }
                lVar29 = lVar29 + 1;
                lVar22 = lVar22 + 0x20;
              } while (lVar29 < ShowExampleAppDocuments(bool*)::app);
            }
            EndMenu();
          }
          bVar6 = MenuItem("Close All Documents",(char *)0x0,false,iVar20 != 0);
          lVar22 = DAT_0022de58;
          if ((bVar6) && (lVar29 = (long)ShowExampleAppDocuments(bool*)::app, 0 < lVar29)) {
            lVar19 = 0;
            do {
              *(undefined1 *)(lVar22 + 0xb + lVar19) = 1;
              lVar19 = lVar19 + 0x20;
            } while (lVar29 * 0x20 != lVar19);
          }
          MenuItem("Exit","Alt+F4",false,true);
          EndMenu();
        }
        EndMenuBar();
      }
      local_50 = p_open;
      if (0 < ShowExampleAppDocuments(bool*)::app) {
        lVar29 = 8;
        lVar22 = 0;
        do {
          lVar19 = DAT_0022de58;
          if (lVar22 != 0) {
            SameLine(0.0,-1.0);
          }
          puVar26 = (undefined8 *)(lVar29 + lVar19 + -8);
          PushID(puVar26);
          bVar6 = Checkbox((char *)*puVar26,(bool *)(lVar29 + lVar19));
          if ((bVar6) && (*(bool *)(lVar29 + lVar19) == false)) {
            *(undefined1 *)(lVar19 + lVar29) = 0;
            *(undefined1 *)(lVar19 + 2 + lVar29) = 0;
          }
          PopID();
          lVar22 = lVar22 + 1;
          lVar29 = lVar29 + 0x20;
        } while (lVar22 < ShowExampleAppDocuments(bool*)::app);
      }
      Separator();
      bVar6 = BeginTabBar("##tabs",0x41);
      if (bVar6) {
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar22 = 9;
          lVar29 = 0;
          do {
            lVar19 = DAT_0022de58;
            if ((*(char *)(DAT_0022de58 + -1 + lVar22) == '\0') &&
               (*(char *)(DAT_0022de58 + lVar22) == '\x01')) {
              SetTabItemClosed(*(char **)(DAT_0022de58 + -9 + lVar22));
            }
            *(undefined1 *)(lVar19 + lVar22) = *(undefined1 *)(lVar19 + -1 + lVar22);
            lVar29 = lVar29 + 1;
            lVar22 = lVar22 + 0x20;
          } while (lVar29 < ShowExampleAppDocuments(bool*)::app);
        }
        if (0 < ShowExampleAppDocuments(bool*)::app) {
          lVar29 = 8;
          lVar22 = 0;
          do {
            lVar19 = DAT_0022de58;
            if (*(char *)(DAT_0022de58 + lVar29) == '\x01') {
              bVar6 = BeginTabItem(*(char **)(DAT_0022de58 + -8 + lVar29),
                                   (bool *)(DAT_0022de58 + lVar29),
                                   (uint)*(byte *)(DAT_0022de58 + 2 + lVar29));
              if ((*(char *)(lVar19 + lVar29) == '\0') && (*(char *)(lVar19 + 2 + lVar29) == '\x01')
                 ) {
                *(undefined1 *)(lVar19 + lVar29) = 1;
                *(undefined1 *)(lVar19 + 3 + lVar29) = 1;
              }
              doc = (MyDocument *)(lVar19 + lVar29 + -8);
              MyDocument::DisplayContextMenu(doc);
              if (bVar6) {
                MyDocument::DisplayContents(doc);
                EndTabItem();
              }
            }
            lVar22 = lVar22 + 1;
            lVar29 = lVar29 + 0x20;
          } while (lVar22 < ShowExampleAppDocuments(bool*)::app);
        }
        EndTabBar();
      }
      p_open = local_50;
      if (ShowExampleAppDocuments(bool*)::close_queue == '\0') {
        ShowDemoWindow();
      }
      if ((ShowExampleAppDocuments(bool*)::close_queue == 0) &&
         (0 < ShowExampleAppDocuments(bool*)::app)) {
        lVar22 = 0;
        lVar29 = 0;
        do {
          lVar19 = DAT_0022de58;
          if (*(char *)(DAT_0022de58 + 0xb + lVar22) == '\x01') {
            *(undefined1 *)(DAT_0022de58 + 0xb + lVar22) = 0;
            if (ShowExampleAppDocuments(bool*)::close_queue == DAT_0022de6c) {
              if (DAT_0022de6c == 0) {
                iVar20 = 8;
              }
              else {
                iVar20 = DAT_0022de6c / 2 + DAT_0022de6c;
              }
              iVar25 = ShowExampleAppDocuments(bool*)::close_queue + 1;
              if (ShowExampleAppDocuments(bool*)::close_queue + 1 < iVar20) {
                iVar25 = iVar20;
              }
              if (DAT_0022de6c < iVar25) {
                pvVar14 = MemAlloc((long)iVar25 << 3);
                if (DAT_0022de70 != (void *)0x0) {
                  memcpy(pvVar14,DAT_0022de70,(long)ShowExampleAppDocuments(bool*)::close_queue << 3
                        );
                  MemFree(DAT_0022de70);
                }
                _close_queue = CONCAT44(iVar25,ShowExampleAppDocuments(bool*)::close_queue);
                DAT_0022de70 = pvVar14;
              }
            }
            *(long *)((long)DAT_0022de70 + (long)ShowExampleAppDocuments(bool*)::close_queue * 8) =
                 lVar19 + lVar22;
            ShowExampleAppDocuments(bool*)::close_queue =
                 ShowExampleAppDocuments(bool*)::close_queue + 1;
          }
          lVar29 = lVar29 + 1;
          lVar22 = lVar22 + 0x20;
        } while (lVar29 < ShowExampleAppDocuments(bool*)::app);
      }
      pvVar14 = DAT_0022de70;
      uVar27 = _close_queue & 0xffffffff;
      if (uVar27 != 0) {
        if (ShowExampleAppDocuments(bool*)::close_queue < 1) {
          iVar20 = 0;
        }
        else {
          uVar18 = 0;
          iVar20 = 0;
          do {
            iVar20 = iVar20 + (uint)*(byte *)(*(long *)((long)DAT_0022de70 + uVar18 * 8) + 10);
            uVar18 = uVar18 + 1;
          } while (uVar27 != uVar18);
        }
        if (iVar20 == 0) {
          if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
            uVar18 = 0;
            do {
              lVar22 = *(long *)((long)pvVar14 + uVar18 * 8);
              *(undefined1 *)(lVar22 + 8) = 0;
              *(undefined1 *)(lVar22 + 10) = 0;
              uVar18 = uVar18 + 1;
            } while (uVar27 != uVar18);
          }
          if (DAT_0022de70 != (void *)0x0) {
            _close_queue = 0;
            MemFree(DAT_0022de70);
            DAT_0022de70 = (void *)0x0;
          }
        }
        else {
          bVar6 = IsPopupOpen("Save?",0);
          if (!bVar6) {
            OpenPopup("Save?",0);
          }
          bVar6 = BeginPopupModal("Save?",(bool *)0x0,0);
          if (bVar6) {
            Text("Save change to the following items?");
            SetNextItemWidth(-1.0);
            bVar6 = ListBoxHeader("##",iVar20,6);
            if (bVar6) {
              if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
                lVar22 = 0;
                do {
                  puVar26 = *(undefined8 **)((long)DAT_0022de70 + lVar22 * 8);
                  if (*(char *)((long)puVar26 + 10) == '\x01') {
                    Text("%s",*puVar26);
                  }
                  lVar22 = lVar22 + 1;
                } while (lVar22 < ShowExampleAppDocuments(bool*)::close_queue);
              }
              ListBoxFooter();
            }
            local_d8._0_4_ = 80.0;
            local_d8._4_4_ = 0.0;
            bVar6 = Button("Yes",(ImVec2 *)local_d8);
            pvVar14 = DAT_0022de70;
            if (bVar6) {
              lVar22 = (long)ShowExampleAppDocuments(bool*)::close_queue;
              if (0 < lVar22) {
                lVar29 = 0;
                do {
                  lVar19 = *(long *)((long)pvVar14 + lVar29 * 8);
                  if (*(char *)(lVar19 + 10) == '\x01') {
                    *(undefined1 *)(lVar19 + 10) = 0;
                  }
                  *(undefined1 *)(lVar19 + 8) = 0;
                  *(undefined1 *)(lVar19 + 10) = 0;
                  lVar29 = lVar29 + 1;
                } while (lVar22 != lVar29);
              }
              if (DAT_0022de70 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_0022de70);
                DAT_0022de70 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            local_d8._0_4_ = 80.0;
            local_d8._4_4_ = 0.0;
            bVar6 = Button("No",(ImVec2 *)local_d8);
            pvVar14 = DAT_0022de70;
            if (bVar6) {
              lVar22 = (long)ShowExampleAppDocuments(bool*)::close_queue;
              if (0 < lVar22) {
                lVar29 = 0;
                do {
                  lVar19 = *(long *)((long)pvVar14 + lVar29 * 8);
                  *(undefined1 *)(lVar19 + 8) = 0;
                  *(undefined1 *)(lVar19 + 10) = 0;
                  lVar29 = lVar29 + 1;
                } while (lVar22 != lVar29);
              }
              if (DAT_0022de70 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_0022de70);
                DAT_0022de70 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            local_d8._0_4_ = 80.0;
            local_d8._4_4_ = 0.0;
            bVar6 = Button("Cancel",(ImVec2 *)local_d8);
            if (bVar6) {
              if (DAT_0022de70 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_0022de70);
                DAT_0022de70 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            EndPopup();
          }
        }
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar20 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar20 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    local_50 = p_open;
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar20 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar20 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    local_d8._0_4_ = 500.0;
    local_d8._4_4_ = 400.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    bVar6 = SmallButton("[Debug] Add 5 entries");
    if (bVar6) {
      iVar20 = 5;
      do {
        uVar9 = GetFrameCount();
        dVar3 = GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",
                   SUB84(dVar3,0),(ulong)uVar9);
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_50;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    local_d8._0_4_ = 500.0;
    local_d8._4_4_ = 440.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar6 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar6) {
      bVar6 = BeginMenuBar();
      if (bVar6) {
        bVar6 = BeginMenu("File",true);
        if (bVar6) {
          bVar6 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar6) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      local_d8._0_4_ = 150.0;
      local_d8._4_4_ = 0.0;
      BeginChild("left pane",(ImVec2 *)local_d8,true,0);
      uVar27 = 0;
      do {
        iVar20 = (int)uVar27;
        sprintf((char *)local_d8,"MyObject %d",uVar27);
        local_158.x = 0.0;
        local_158.y = 0.0;
        bVar6 = Selectable((char *)local_d8,iVar20 == ShowExampleAppLayout(bool*)::selected,0,
                           &local_158);
        if (bVar6) {
          ShowExampleAppLayout(bool*)::selected = iVar20;
        }
        uVar27 = (ulong)(iVar20 + 1U);
      } while (iVar20 + 1U != 100);
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar31 = GetFrameHeightWithSpacing();
      local_d8 = (undefined1  [8])((ulong)(uint)fVar31 << 0x20 ^ 0x8000000000000000);
      BeginChild("item view",(ImVec2 *)local_d8,false,0);
      Text("MyObject: %d");
      Separator();
      bVar6 = BeginTabBar("##Tabs",0);
      if (bVar6) {
        bVar6 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar6) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar6 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar6) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      Button("Revert",(ImVec2 *)local_d8);
      SameLine(0.0,-1.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      Button("Save",(ImVec2 *)local_d8);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    local_d8._0_4_ = 430.0;
    local_d8._4_4_ = 450.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar6 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar6) {
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      local_d8._0_4_ = 2.0;
      local_d8._4_4_ = 2.0;
      PushStyleVar(10,(ImVec2 *)local_d8);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar6 = BeginTable("split",2,0x501,(ImVec2 *)local_d8,0.0);
      if (bVar6) {
        iVar20 = 0;
        do {
          ShowPlaceholderObject("Object",iVar20);
          iVar20 = iVar20 + 1;
        } while (iVar20 != 4);
        EndTable();
      }
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    local_d8._0_4_ = 520.0;
    local_d8._4_4_ = 600.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar6 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar6) {
      if (ShowExampleAppLongText(bool*)::log == '\0') {
        ShowDemoWindow();
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar27 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar27 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar27)
      ;
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar6 = Button("Clear",(ImVec2 *)local_d8);
      if (bVar6) {
        if (DAT_0022dde0 != (char *)0x0) {
          _log = 0;
          MemFree(DAT_0022dde0);
          DAT_0022dde0 = (char *)0x0;
        }
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar6 = Button("Add 1000 lines",(ImVec2 *)local_d8);
      if (bVar6) {
        iVar20 = 0;
        do {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar20));
          iVar20 = iVar20 + 1;
        } while (iVar20 != 1000);
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      BeginChild("Log",(ImVec2 *)local_d8,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        PushStyleVar(0xd,(ImVec2 *)local_d8);
        if (0 < (int)ShowExampleAppLongText(bool*)::lines) {
          uVar27 = 0;
          do {
            Text("%i The quick brown fox jumps over the lazy dog",uVar27);
            uVar9 = (int)uVar27 + 1;
            uVar27 = (ulong)uVar9;
          } while ((int)uVar9 < (int)ShowExampleAppLongText(bool*)::lines);
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        PushStyleVar(0xd,(ImVec2 *)local_d8);
        ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_d8);
        ImGuiListClipper::Begin
                  ((ImGuiListClipper *)local_d8,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar6 = ImGuiListClipper::Step((ImGuiListClipper *)local_d8), bVar6) {
          fVar31 = (float)local_d8._0_4_;
          while( true ) {
            if ((int)local_d8._4_4_ <= (int)fVar31) break;
            Text("%i The quick brown fox jumps over the lazy dog",(ulong)(uint)fVar31);
            fVar31 = (float)((int)fVar31 + 1);
          }
        }
        PopStyleVar(1);
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_d8);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        pcVar23 = ImGuiTextBuffer::EmptyString;
        pcVar24 = ImGuiTextBuffer::EmptyString;
        if ((DAT_0022dde0 != (char *)0x0) &&
           (pcVar24 = DAT_0022dde0, ShowExampleAppLongText(bool*)::log < 1)) {
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.h"
                        ,0x665,"const T &ImVector<char>::front() const [T = char]");
        }
        if (DAT_0022dde0 != (char *)0x0) {
          if ((long)ShowExampleAppLongText(bool*)::log < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.h"
                          ,0x667,"const T &ImVector<char>::back() const [T = char]");
          }
          pcVar23 = DAT_0022dde0 + (long)ShowExampleAppLongText(bool*)::log + -1;
        }
        TextUnformatted(pcVar24,pcVar23);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar6 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar6) {
      TextUnformatted("Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
                      ,(char *)0x0);
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d",0);
      if (0 < ShowExampleAppAutoResize(bool*)::lines) {
        uVar27 = 0;
        iVar20 = 0;
        do {
          Text("%*sThis is line %d",uVar27,"");
          iVar20 = iVar20 + 1;
          uVar27 = (ulong)((int)uVar27 + 4);
        } while (iVar20 < ShowExampleAppAutoResize(bool*)::lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    local_a8 = "Custom: Fixed Steps (100)";
    local_b8 = "Height 400-500";
    pcStack_b0 = "Custom: Always Square";
    local_c8 = (ImVec2)0x1c969e;
    IStack_c0 = (ImVec2)0x1c96b8;
    local_d8 = (undefined1  [8])0x1c9672;
    IStack_d0 = (ImVec2)0x1c9687;
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      local_158.x = -1.0;
      local_158.y = 0.0;
      local_110.x = -1.0;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_158,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      local_158.x = 0.0;
      local_158.y = -1.0;
      local_110.x = 3.4028235e+38;
      local_110.y = -1.0;
      SetNextWindowSizeConstraints(&local_158,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      local_158.x = 100.0;
      local_158.y = 100.0;
      local_110.x = 3.4028235e+38;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_158,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      local_158.x = 400.0;
      local_158.y = -1.0;
      local_110.x = 500.0;
      local_110.y = -1.0;
      SetNextWindowSizeConstraints(&local_158,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      local_158.x = -1.0;
      local_158.y = 400.0;
      local_110.x = -1.0;
      local_110.y = 500.0;
      SetNextWindowSizeConstraints(&local_158,&local_110,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      local_158.x = 0.0;
      local_158.y = 0.0;
      local_110.x = 3.4028235e+38;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_158,&local_110,ShowExampleAppConstrainedResize::CustomConstraints::Square,
                 (void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      local_158.x = 0.0;
      local_158.y = 0.0;
      local_110.x = 3.4028235e+38;
      local_110.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_158,&local_110,ShowExampleAppConstrainedResize::CustomConstraints::Step,
                 (void *)0x64);
    }
    bVar6 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                  (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar6) {
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar6 = Button("200x200",&local_158);
      if (bVar6) {
        local_158.x = 200.0;
        local_158.y = 200.0;
        SetWindowSize(&local_158,0);
      }
      SameLine(0.0,-1.0);
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar6 = Button("500x500",&local_158);
      if (bVar6) {
        local_158.x = 500.0;
        local_158.y = 500.0;
        SetWindowSize(&local_158,0);
      }
      SameLine(0.0,-1.0);
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar6 = Button("800x200",&local_158);
      if (bVar6) {
        local_158.x = 800.0;
        local_158.y = 200.0;
        SetWindowSize(&local_158,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)local_d8,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d",0);
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      if (0 < ShowExampleAppConstrainedResize(bool*)::display_lines) {
        uVar27 = 0;
        iVar20 = 0;
        do {
          Text("%*sHello, sailor! Making this line long enough for the example.",uVar27,"");
          iVar20 = iVar20 + 1;
          uVar27 = (ulong)((int)uVar27 + 4);
        } while (iVar20 < ShowExampleAppConstrainedResize(bool*)::display_lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar15 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff) {
      flags = 0xc116b;
    }
    else {
      local_d8._4_4_ = 10.0;
      local_d8._0_4_ = 10.0;
      bVar6 = (ShowExampleAppSimpleOverlay(bool*)::corner & 1) != 0;
      if (bVar6) {
        local_d8._0_4_ = (pIVar15->DisplaySize).x + -10.0;
      }
      local_158.y = 0.0;
      local_158.x = 0.0;
      if (bVar6) {
        local_158.x = 1.0;
      }
      bVar6 = (ShowExampleAppSimpleOverlay(bool*)::corner & 2) != 0;
      if (bVar6) {
        local_d8._4_4_ = (pIVar15->DisplaySize).y + -10.0;
      }
      if (bVar6) {
        local_158.y = 1.0;
      }
      SetNextWindowPos((ImVec2 *)local_d8,1,&local_158);
      flags = 0xc116f;
    }
    SetNextWindowBgAlpha(0.35);
    bVar6 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,flags);
    if (bVar6) {
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar6 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar6) {
        Text("Mouse Position: (%.1f,%.1f)",SUB84((double)(pIVar15->MousePos).x,0));
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar6 = BeginPopupContextWindow((char *)0x0,1);
      if (bVar6) {
        bVar6 = MenuItem("Custom",(char *)0x0,
                         ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar6 = MenuItem("Top-left",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 0,true
                        );
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar6 = MenuItem("Top-right",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 1,
                         true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar6 = MenuItem("Bottom-left",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 2,
                         true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar6 = MenuItem("Bottom-right",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 3,
                         true);
        if (bVar6) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar6 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar6) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    local_d8._0_4_ = 100.0;
    local_d8._4_4_ = 100.0;
    local_158.x = 0.0;
    local_158.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_d8,4,&local_158);
    Begin("Same title as another window##1",(bool *)0x0,0);
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    local_d8._0_4_ = 100.0;
    local_d8._4_4_ = 200.0;
    local_158.x = 0.0;
    local_158.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_d8,4,&local_158);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar3 = GetTime();
    cVar1 = "|/-\\"[(int)(dVar3 * 4.0) & 3];
    GetFrameCount();
    sprintf(local_d8,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar1);
    local_158.x = 100.0;
    local_158.y = 300.0;
    local_110.x = 0.0;
    local_110.y = 0.0;
    SetNextWindowPos(&local_158,4,&local_110);
    Begin(local_d8,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering == true) {
    bVar6 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
    if ((bVar6) && (bVar6 = BeginTabBar("##TabBar",0), bVar6)) {
      bVar6 = BeginTabItem("Primitives",(bool *)0x0,0);
      local_50 = p_open;
      if (bVar6) {
        fVar31 = GetFontSize();
        PushItemWidth(fVar31 * -15.0);
        pIVar16 = GetWindowDrawList();
        iVar20 = 0;
        Text("Gradients");
        local_138._0_4_ = CalcItemWidth();
        local_110.y = GetFrameHeight();
        local_110.x = (float)local_138._0_4_;
        local_d8 = (undefined1  [8])GetCursorScreenPos();
        local_158.y = (float)local_d8._4_4_ + local_110.y;
        local_158.x = (float)local_d8._0_4_ + local_110.x;
        IVar10 = GetColorU32(0xff000000);
        IVar11 = GetColorU32(0xffffffff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,IVar11,IVar11,IVar10);
        InvisibleButton("##gradient1",&local_110,0);
        local_d8 = (undefined1  [8])GetCursorScreenPos();
        local_158.y = (float)local_d8._4_4_ + local_110.y;
        local_158.x = (float)local_d8._0_4_ + local_110.x;
        IVar10 = GetColorU32(0xff00ff00);
        IVar11 = GetColorU32(0xff0000ff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,IVar11,IVar11,IVar10);
        InvisibleButton("##gradient2",&local_110,0);
        Text("All primitives");
        if (ShowExampleAppCustomRendering(bool*)::colf == '\0') {
          ShowDemoWindow();
        }
        DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,72.0,"%.0f",0);
        DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,"%.02f",
                  0);
        SliderInt("N-gon sides",&ShowExampleAppCustomRendering(bool*)::ngon_sides,3,0xc,"%d",0);
        Checkbox("##circlesegmentoverride",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::circle_segments_override);
        pIVar17 = GetStyle();
        SameLine(0.0,(pIVar17->ItemInnerSpacing).x);
        bVar6 = SliderInt("Circle segments override",
                          &ShowExampleAppCustomRendering(bool*)::circle_segments_override_v,3,0x28,
                          "%d",0);
        ShowExampleAppCustomRendering(bool*)::circle_segments_override =
             ShowExampleAppCustomRendering(bool*)::circle_segments_override | bVar6;
        Checkbox("##curvessegmentoverride",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::curve_segments_override);
        pIVar17 = GetStyle();
        SameLine(0.0,(pIVar17->ItemInnerSpacing).x);
        bVar6 = SliderInt("Curves segments override",
                          &ShowExampleAppCustomRendering(bool*)::curve_segments_override_v,3,0x28,
                          "%d",0);
        ShowExampleAppCustomRendering(bool*)::curve_segments_override =
             ShowExampleAppCustomRendering(bool*)::curve_segments_override | bVar6;
        ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
        IVar4 = GetCursorScreenPos();
        fStack_130 = (float)extraout_XMM0_Dc;
        local_138._0_4_ = IVar4.x;
        local_138._4_4_ = IVar4.y;
        fStack_12c = (float)extraout_XMM0_Dd;
        local_d8 = (undefined1  [8])ShowExampleAppCustomRendering(bool*)::colf._0_8_;
        IStack_d0.x = (float)ShowExampleAppCustomRendering(bool*)::colf._8_4_;
        IStack_d0.y = (float)ShowExampleAppCustomRendering(bool*)::colf._12_4_;
        IVar10 = ColorConvertFloat4ToU32((ImVec4 *)local_d8);
        local_dc = 0;
        if (ShowExampleAppCustomRendering(bool*)::circle_segments_override != 0) {
          local_dc = ShowExampleAppCustomRendering(bool*)::circle_segments_override_v;
        }
        iVar25 = 0;
        if (ShowExampleAppCustomRendering(bool*)::curve_segments_override != 0) {
          iVar25 = ShowExampleAppCustomRendering(bool*)::curve_segments_override_v;
        }
        local_48._4_4_ = local_138._4_4_;
        local_48._0_4_ = (float)local_138._0_4_ + 4.0;
        uStack_40 = fStack_130;
        uStack_3c = fStack_12c;
        local_138._0_4_ = (float)local_138._4_4_ + 4.0;
        fStack_130 = (float)local_138._4_4_;
        fStack_12c = (float)local_138._4_4_;
        do {
          fVar31 = 1.0;
          if (iVar20 != 0) {
            fVar31 = ShowExampleAppCustomRendering(bool*)::thickness;
          }
          local_128._0_4_ = fVar31;
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_d8._4_4_ = fVar32 + (float)local_138._0_4_;
          local_d8._0_4_ = fVar32 + (float)local_48._0_4_;
          ImDrawList::AddNgon(pIVar16,(ImVec2 *)local_d8,fVar32,IVar10,
                              ShowExampleAppCustomRendering(bool*)::ngon_sides,fVar31);
          fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_48._0_4_;
          fVar31 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_d8._4_4_ = fVar31 + (float)local_138._0_4_;
          local_d8._0_4_ = fVar31 + fVar32;
          local_108._0_4_ = fVar32;
          ImDrawList::AddCircle
                    (pIVar16,(ImVec2 *)local_d8,fVar31,IVar10,local_dc,(float)local_128._0_4_);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_d8._4_4_ = local_138._0_4_;
          local_d8._0_4_ = local_108._0_4_;
          local_158.y = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          ImDrawList::AddRect(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,0.0,0,
                              (float)local_128._0_4_);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_d8._4_4_ = local_138._0_4_;
          local_d8._0_4_ = local_108._0_4_;
          local_158.y = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          ImDrawList::AddRect(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,10.0,0xf,
                              (float)local_128._0_4_);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_d8._4_4_ = local_138._0_4_;
          local_d8._0_4_ = local_108._0_4_;
          local_158.y = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          ImDrawList::AddRect(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,10.0,9,
                              (float)local_128._0_4_);
          local_e8.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          local_d8._4_4_ = local_138._0_4_;
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_e8.x;
          local_e8.y = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
          local_158.y = local_e8.y;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + local_e8.x;
          local_108._0_4_ = local_e8.x;
          ImDrawList::AddTriangle
                    (pIVar16,(ImVec2 *)local_d8,&local_158,&local_e8,IVar10,(float)local_128._0_4_);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_d8._4_4_ = local_138._0_4_;
          local_d8._0_4_ = local_108._0_4_;
          local_158.y = (float)local_138._0_4_;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_108._0_4_;
          ImDrawList::AddLine(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,(float)local_128._0_4_);
          local_108._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_
          ;
          local_d8._4_4_ = local_138._0_4_;
          local_d8._0_4_ = local_108._0_4_;
          local_158.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_;
          local_158.x = (float)local_108._0_4_;
          ImDrawList::AddLine(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,(float)local_128._0_4_);
          local_108._0_4_ = (float)local_108._0_4_ + 10.0;
          local_d8._4_4_ = local_138._0_4_;
          local_d8._0_4_ = local_108._0_4_;
          local_158.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_;
          local_158.x = (float)local_108._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddLine(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,(float)local_128._0_4_);
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          local_158.y = ShowExampleAppCustomRendering(bool*)::sz * 0.6 + (float)local_138._0_4_;
          local_150.x = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_158.x;
          local_108._0_4_ = local_158.x;
          local_150.y = ShowExampleAppCustomRendering(bool*)::sz * -0.4 + (float)local_138._0_4_;
          local_148[0].y = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_148[0].x = ShowExampleAppCustomRendering(bool*)::sz + local_158.x;
          ImDrawList::AddBezierQuadratic
                    (pIVar16,&local_158,&local_150,local_148,IVar10,(float)local_128._0_4_,iVar25);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_108._0_4_;
          local_d8._4_4_ = local_138._0_4_;
          IStack_d0.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + (float)local_138._0_4_;
          IStack_d0.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + (float)local_d8._0_4_;
          local_c8.y = (ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_) -
                       ShowExampleAppCustomRendering(bool*)::sz * 0.3;
          local_c8.x = ((float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz) -
                       ShowExampleAppCustomRendering(bool*)::sz * 1.3;
          IStack_c0.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_;
          IStack_c0.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddBezierCubic
                    (pIVar16,(ImVec2 *)local_d8,&IStack_d0,&local_c8,&IStack_c0,IVar10,
                     (float)local_128._0_4_,iVar25);
          local_138._0_4_ = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0
          ;
          iVar20 = iVar20 + 1;
        } while (iVar20 == 1);
        fVar31 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        local_d8._4_4_ = fVar31 + (float)local_138._0_4_;
        local_d8._0_4_ = fVar31 + (float)local_48._0_4_;
        ImDrawList::AddNgonFilled
                  (pIVar16,(ImVec2 *)local_d8,fVar31,IVar10,
                   ShowExampleAppCustomRendering(bool*)::ngon_sides);
        fVar32 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_48._0_4_;
        fVar31 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
        local_d8._4_4_ = fVar31 + (float)local_138._0_4_;
        local_d8._0_4_ = fVar31 + fVar32;
        local_128._0_4_ = fVar32;
        ImDrawList::AddCircleFilled(pIVar16,(ImVec2 *)local_d8,fVar31,IVar10,local_dc);
        local_128._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        local_d8._4_4_ = local_138._0_4_;
        local_d8._0_4_ = local_128._0_4_;
        local_158.y = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_128._0_4_;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,0.0,0xf);
        local_128._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        local_d8._4_4_ = local_138._0_4_;
        local_d8._0_4_ = local_128._0_4_;
        local_158.y = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_128._0_4_;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,10.0,0xf);
        local_128._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        local_d8._4_4_ = local_138._0_4_;
        local_d8._0_4_ = local_128._0_4_;
        local_158.y = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_128._0_4_;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,10.0,9);
        local_e8.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        local_d8._4_4_ = local_138._0_4_;
        local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_e8.x;
        local_e8.y = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + -0.5;
        local_158.y = local_e8.y;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + local_e8.x;
        local_128._0_4_ = local_e8.x;
        ImDrawList::AddTriangleFilled(pIVar16,(ImVec2 *)local_d8,&local_158,&local_e8,IVar10);
        local_128._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        local_d8._4_4_ = local_138._0_4_;
        local_d8._0_4_ = local_128._0_4_;
        local_158.y = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_138._0_4_;
        local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_128._0_4_;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,0.0,0xf);
        local_128._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_128._0_4_;
        local_d8._4_4_ = local_138._0_4_;
        local_d8._0_4_ = local_128._0_4_;
        local_158.y = ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_;
        local_158.x = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_128._0_4_;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,0.0,0xf);
        local_128._0_4_ = (float)local_128._0_4_ + 20.0;
        local_d8._4_4_ = local_138._0_4_;
        local_d8._0_4_ = local_128._0_4_;
        local_158.y = (float)local_138._0_4_ + 1.0;
        local_158.x = (float)local_128._0_4_ + 1.0;
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_d8,&local_158,IVar10,0.0,0xf);
        local_d8._4_4_ = local_138._0_4_;
        local_d8._0_4_ = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.y = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
        local_158.x = (float)local_128._0_4_ + ShowExampleAppCustomRendering(bool*)::sz +
                      ShowExampleAppCustomRendering(bool*)::sz;
        ImDrawList::AddRectFilledMultiColor
                  (pIVar16,(ImVec2 *)local_d8,&local_158,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00
                  );
        local_d8._4_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0;
        local_d8._0_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 10.2;
        Dummy((ImVec2 *)local_d8);
        PopItemWidth();
        EndTabItem();
      }
      p_open = local_50;
      bVar6 = BeginTabItem("Canvas",(bool *)0x0,0);
      if (bVar6) {
        if (ShowExampleAppCustomRendering(bool*)::points == '\0') {
          ShowDemoWindow();
        }
        if (ShowExampleAppCustomRendering(bool*)::scrolling == '\0') {
          ShowDemoWindow();
        }
        Checkbox("Enable grid",(bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_grid);
        Checkbox("Enable context menu",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu);
        Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.")
        ;
        local_d8 = (undefined1  [8])GetCursorScreenPos();
        local_158 = GetContentRegionAvail();
        if (local_158.x < 50.0) {
          local_158.x = 50.0;
        }
        if (local_158.y < 50.0) {
          local_158.y = 50.0;
        }
        local_110.y = (float)local_d8._4_4_ + local_158.y;
        local_110.x = (float)local_d8._0_4_ + local_158.x;
        pIVar15 = GetIO();
        pIVar16 = GetWindowDrawList();
        ImDrawList::AddRectFilled(pIVar16,(ImVec2 *)local_d8,&local_110,0xff323232,0.0,0xf);
        ImDrawList::AddRect(pIVar16,(ImVec2 *)local_d8,&local_110,0xffffffff,0.0,0xf,1.0);
        InvisibleButton("canvas",&local_158,3);
        bVar6 = IsItemHovered(0);
        bVar7 = IsItemActive();
        local_138._0_4_ = (float)local_d8._0_4_ + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0
        ;
        local_128._0_4_ = (float)local_d8._4_4_ + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1
        ;
        local_e8.x = (pIVar15->MousePos).x -
                     ((float)local_d8._0_4_ + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0);
        local_e8.y = (pIVar15->MousePos).y -
                     ((float)local_d8._4_4_ + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1);
        if (((bVar6) && (ShowExampleAppCustomRendering(bool*)::adding_line == '\0')) &&
           (bVar6 = IsMouseClicked(0,false), bVar6)) {
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_e8);
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_e8);
          ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
        }
        p_open = local_50;
        if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
          if ((long)ShowExampleAppCustomRendering(bool*)::points < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.h"
                          ,0x666,"T &ImVector<ImVec2>::back() [T = ImVec2]");
          }
          *(ulong *)((long)DAT_0022de28 +
                    (long)ShowExampleAppCustomRendering(bool*)::points * 8 + -8) =
               CONCAT44(local_e8.y,local_e8.x);
          bVar6 = IsMouseDown(0);
          if (!bVar6) {
            ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
          }
        }
        if (bVar7) {
          if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\0') {
            fVar31 = 0.0;
          }
          else {
            fVar31 = -1.0;
          }
          bVar6 = IsMouseDragging(1,fVar31);
          if (bVar6) {
            _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 =
                 (pIVar15->MouseDelta).x + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0;
            _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 =
                 (pIVar15->MouseDelta).y + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1;
          }
        }
        IVar4 = GetMouseDragDelta(1,-1.0);
        if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\x01') {
          local_108._8_4_ = extraout_XMM0_Dc_00;
          local_108._0_4_ = IVar4.x;
          local_108._4_4_ = IVar4.y;
          local_108._12_4_ = extraout_XMM0_Dd_00;
          bVar6 = IsMouseReleased(1);
          if (((bVar6) && ((float)local_108._0_4_ == 0.0)) &&
             ((!NAN((float)local_108._0_4_) &&
              (((float)local_108._4_4_ == 0.0 && (!NAN((float)local_108._4_4_))))))) {
            OpenPopupOnItemClick("context",1);
          }
        }
        bVar6 = BeginPopup("context",0);
        if (bVar6) {
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
            uVar9 = ShowExampleAppCustomRendering(bool*)::points - 2;
            if (DAT_0022de24 < (int)uVar9) {
              if (DAT_0022de24 == 0) {
                uVar28 = 8;
              }
              else {
                uVar28 = DAT_0022de24 / 2 + DAT_0022de24;
              }
              if ((int)uVar28 <= (int)uVar9) {
                uVar28 = uVar9;
              }
              if (DAT_0022de24 < (int)uVar28) {
                pvVar14 = MemAlloc((long)(int)uVar28 << 3);
                if (DAT_0022de28 != (void *)0x0) {
                  memcpy(pvVar14,DAT_0022de28,
                         (long)ShowExampleAppCustomRendering(bool*)::points << 3);
                  MemFree(DAT_0022de28);
                }
                _points = (ulong)uVar28 << 0x20;
                DAT_0022de28 = pvVar14;
              }
            }
            _points = CONCAT44(DAT_0022de24,uVar9);
          }
          ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
          bVar6 = MenuItem("Remove one",(char *)0x0,false,
                           0 < ShowExampleAppCustomRendering(bool*)::points);
          if (bVar6) {
            uVar9 = ShowExampleAppCustomRendering(bool*)::points - 2;
            if (DAT_0022de24 < (int)uVar9) {
              if (DAT_0022de24 == 0) {
                uVar28 = 8;
              }
              else {
                uVar28 = DAT_0022de24 / 2 + DAT_0022de24;
              }
              if ((int)uVar28 <= (int)uVar9) {
                uVar28 = uVar9;
              }
              if (DAT_0022de24 < (int)uVar28) {
                pvVar14 = MemAlloc((long)(int)uVar28 << 3);
                if (DAT_0022de28 != (void *)0x0) {
                  memcpy(pvVar14,DAT_0022de28,
                         (long)ShowExampleAppCustomRendering(bool*)::points << 3);
                  MemFree(DAT_0022de28);
                }
                _points = (ulong)uVar28 << 0x20;
                DAT_0022de28 = pvVar14;
              }
            }
            _points = CONCAT44(DAT_0022de24,uVar9);
          }
          bVar6 = MenuItem("Remove all",(char *)0x0,false,
                           0 < ShowExampleAppCustomRendering(bool*)::points);
          if ((bVar6) && (DAT_0022de28 != (void *)0x0)) {
            _points = 0;
            MemFree(DAT_0022de28);
            DAT_0022de28 = (void *)0x0;
          }
          EndPopup();
        }
        ImDrawList::PushClipRect(pIVar16,(ImVec2)local_d8,local_110,true);
        if (ShowExampleAppCustomRendering(bool*)::opt_enable_grid == '\x01') {
          fVar31 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0,64.0);
          if (fVar31 < local_158.x) {
            do {
              local_108._0_4_ = fVar31;
              local_f8.x = (float)local_d8._0_4_ + fVar31;
              local_f0.y = (float)local_d8._4_4_;
              local_f8.y = local_110.y;
              local_f0.x = local_f8.x;
              ImDrawList::AddLine(pIVar16,&local_f0,&local_f8,0x28c8c8c8,1.0);
              fVar31 = (float)local_108._0_4_ + 64.0;
            } while (fVar31 < local_158.x);
          }
          fVar31 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1,64.0);
          if (fVar31 < local_158.y) {
            do {
              local_108._0_4_ = fVar31;
              local_f8.y = (float)local_d8._4_4_ + fVar31;
              local_f0.x = (float)local_d8._0_4_;
              local_f8.x = local_110.x;
              local_f0.y = local_f8.y;
              ImDrawList::AddLine(pIVar16,&local_f0,&local_f8,0x28c8c8c8,1.0);
              fVar31 = (float)local_108._0_4_ + 64.0;
            } while (fVar31 < local_158.y);
          }
        }
        if (0 < ShowExampleAppCustomRendering(bool*)::points) {
          lVar22 = 1;
          do {
            local_f0.x = *(float *)((long)DAT_0022de28 + lVar22 * 8 + -8) + (float)local_138._0_4_;
            local_f0.y = *(float *)((long)DAT_0022de28 + lVar22 * 8 + -4) + (float)local_128._0_4_;
            if (ShowExampleAppCustomRendering(bool*)::points <= lVar22) {
              __assert_fail("i >= 0 && i < Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.h"
                            ,0x65c,"T &ImVector<ImVec2>::operator[](int) [T = ImVec2]");
            }
            local_f8.x = *(float *)((long)DAT_0022de28 + lVar22 * 8) + (float)local_138._0_4_;
            local_f8.y = *(float *)((long)DAT_0022de28 + lVar22 * 8 + 4) + (float)local_128._0_4_;
            ImDrawList::AddLine(pIVar16,&local_f0,&local_f8,0xff00ffff,2.0);
            iVar20 = (int)lVar22;
            lVar22 = lVar22 + 2;
          } while (iVar20 + 1 < ShowExampleAppCustomRendering(bool*)::points);
        }
        ImDrawList::PopClipRect(pIVar16);
        EndTabItem();
      }
      bVar6 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
      if (bVar6) {
        Checkbox("Draw in Background draw list",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg);
        SameLine(0.0,-1.0);
        HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
        Checkbox("Draw in Foreground draw list",
                 (bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg);
        SameLine(0.0,-1.0);
        HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
        IVar4 = GetWindowPos();
        fStack_130 = (float)extraout_XMM0_Dc_01;
        local_138._0_4_ = IVar4.x;
        local_138._4_4_ = IVar4.y;
        fStack_12c = (float)extraout_XMM0_Dd_01;
        IVar4 = GetWindowSize();
        fVar31 = IVar4.y;
        uVar5 = local_138._4_4_;
        local_d8._0_4_ = IVar4.x * 0.5 + (float)local_138._0_4_;
        local_138._4_4_ = fVar31;
        local_138._0_4_ = fVar31;
        fStack_130 = fVar31;
        fStack_12c = fVar31;
        local_d8._4_4_ = fVar31 * 0.5 + (float)uVar5;
        if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
          local_128._8_4_ = extraout_XMM0_Dc_02;
          local_128._0_4_ = IVar4.x;
          local_128._4_4_ = IVar4.y;
          local_128._12_4_ = extraout_XMM0_Dd_02;
          pIVar16 = GetBackgroundDrawList();
          ImDrawList::AddCircle
                    (pIVar16,(ImVec2 *)local_d8,(float)local_128._0_4_ * 0.6,0xc80000ff,0,14.0);
        }
        if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
          pIVar16 = GetForegroundDrawList();
          ImDrawList::AddCircle
                    (pIVar16,(ImVec2 *)local_d8,(float)local_138._0_4_ * 0.6,0xc800ff00,0,10.0);
        }
        EndTabItem();
      }
      EndTabBar();
    }
    End();
  }
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Dear ImGui Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  uVar9 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar9 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar28 = uVar9 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar28 = uVar9;
  }
  uVar9 = uVar28 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar9 = uVar28;
  }
  uVar28 = uVar9 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar28 = uVar9;
  }
  uVar9 = uVar28 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar9 = uVar28;
  }
  uVar28 = uVar9 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar28 = uVar9;
  }
  uVar9 = uVar28 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar9 = uVar28;
  }
  uVar28 = uVar9 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar28 = uVar9;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (bool *)0x0;
  }
  local_d8._0_4_ = 650.0;
  local_d8._4_4_ = 20.0;
  local_158.x = 0.0;
  local_158.y = 0.0;
  SetNextWindowPos((ImVec2 *)local_d8,4,&local_158);
  local_d8._0_4_ = 550.0;
  local_d8._4_4_ = 680.0;
  SetNextWindowSize((ImVec2 *)local_d8,4);
  bVar6 = Begin("Dear ImGui Demo",p_open,uVar28);
  if (bVar6) {
    fVar31 = GetFontSize();
    PushItemWidth(fVar31 * -12.0);
    bVar6 = BeginMenuBar();
    if (bVar6) {
      bVar6 = BeginMenu("Menu",true);
      if (bVar6) {
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar6 = BeginMenu("Examples",true);
      if (bVar6) {
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar6 = BeginMenu("Tools",true);
      if (bVar6) {
        MenuItem("Metrics/Debugger",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    bVar6 = CollapsingHeader("Help",0);
    if (bVar6) {
      Text("ABOUT THIS DEMO:");
      BulletText("Sections below are demonstrating many aspects of the library.");
      BulletText("The \"Examples\" menu above leads to more demo contents.");
      BulletText(
                "The \"Tools\" menu above gives access to: About Box, Style Editor,\nand Metrics/Debugger (general purpose Dear ImGui debugging tool)."
                );
      Separator();
      Text("PROGRAMMER GUIDE:");
      BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("See comments in imgui.cpp.");
      BulletText("See example applications in the examples/ folder.");
      BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
      BulletText("Set \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Set \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    bVar6 = CollapsingHeader("Configuration",0);
    if (bVar6) {
      pIVar15 = GetIO();
      bVar6 = TreeNode("Configuration##2");
      if (bVar6) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",&pIVar15->ConfigFlags,1);
        SameLine(0.0,-1.0);
        HelpMarker("Enable keyboard controls.");
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",&pIVar15->ConfigFlags,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",&pIVar15->ConfigFlags,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",&pIVar15->ConfigFlags,0x10);
        if ((pIVar15->ConfigFlags & 0x10) != 0) {
          dVar3 = GetTime();
          fVar31 = fmodf((float)dVar3,0.4);
          if (fVar31 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          iVar20 = GetKeyIndex(0xc);
          bVar6 = IsKeyPressed(iVar20,true);
          if (bVar6) {
            *(byte *)&pIVar15->ConfigFlags = (byte)pIVar15->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",&pIVar15->ConfigFlags,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar15->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
        Checkbox("io.ConfigDragClickToInputText",&pIVar15->ConfigDragClickToInputText);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving)."
                  );
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar15->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar15->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar15->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        Text("Also see Style->Rendering for rendering options.");
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Backend Flags");
      if (bVar6) {
        HelpMarker(
                  "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\nHere we expose then as read-only fields to avoid breaking interactions with your backend."
                  );
        local_d8._0_4_ = pIVar15->BackendFlags;
        CheckboxFlags("io.BackendFlags: HasGamepad",(int *)local_d8,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(int *)local_d8,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(int *)local_d8,4);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(int *)local_d8,8);
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Style");
      if (bVar6) {
        HelpMarker(
                  "The same contents can be accessed in \'Tools->Style Editor\' or by calling the ShowStyleEditor() function."
                  );
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      bVar6 = TreeNode("Capture/Logging");
      if (bVar6) {
        HelpMarker(
                  "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.\nTry opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        HelpMarker(
                  "You can also call ImGui::LogText() to output directly to the log without a visual output."
                  );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar6 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)local_d8);
        if (bVar6) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    bVar6 = CollapsingHeader("Window options",0);
    if (bVar6) {
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar6 = BeginTable("split",3,0,(ImVec2 *)local_d8,0.0);
      if (bVar6) {
        TableNextColumn();
        Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
        TableNextColumn();
        Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
        TableNextColumn();
        Checkbox("No menu",&ShowDemoWindow::no_menu);
        TableNextColumn();
        Checkbox("No move",&ShowDemoWindow::no_move);
        TableNextColumn();
        Checkbox("No resize",&ShowDemoWindow::no_resize);
        TableNextColumn();
        Checkbox("No collapse",&ShowDemoWindow::no_collapse);
        TableNextColumn();
        Checkbox("No close",&ShowDemoWindow::no_close);
        TableNextColumn();
        Checkbox("No nav",&ShowDemoWindow::no_nav);
        TableNextColumn();
        Checkbox("No background",&ShowDemoWindow::no_background);
        TableNextColumn();
        Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
        EndTable();
      }
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    bVar6 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar6) {
      bVar6 = TreeNode("Popups");
      if (bVar6) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar6 = Button("Select..",(ImVec2 *)local_d8);
        if (bVar6) {
          OpenPopup("my_select_popup",0);
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar24 = "<None>";
        }
        else {
          pcVar24 = (&PTR_anon_var_dwarf_3f36c_00222cc0)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar24,(char *)0x0);
        bVar6 = BeginPopup("my_select_popup",0);
        if (bVar6) {
          lVar22 = 0;
          Text("Aquarium");
          Separator();
          ppuVar30 = &PTR_anon_var_dwarf_3f36c_00222cc0;
          do {
            local_d8._0_4_ = 0.0;
            local_d8._4_4_ = 0.0;
            bVar6 = Selectable(*ppuVar30,false,0,(ImVec2 *)local_d8);
            if (bVar6) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar22;
            }
            lVar22 = lVar22 + 1;
            ppuVar30 = ppuVar30 + 1;
          } while (lVar22 != 5);
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar6 = Button("Toggle..",(ImVec2 *)local_d8);
        if (bVar6) {
          OpenPopup("my_toggle_popup",0);
        }
        bVar6 = BeginPopup("my_toggle_popup",0);
        if (bVar6) {
          pbVar21 = (bool *)&ShowDemoWindowPopups()::toggles;
          lVar22 = 0;
          do {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_3f36c_00222cc0 + lVar22),"",pbVar21,true);
            lVar22 = lVar22 + 8;
            pbVar21 = pbVar21 + 1;
          } while (lVar22 != 0x28);
          bVar6 = BeginMenu("Sub-menu",true);
          if (bVar6) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar6 = IsItemHovered(0);
          if (bVar6) {
            SetTooltip("I am a tooltip over a popup");
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar6 = Button("Stacked Popup",(ImVec2 *)local_d8);
          if (bVar6) {
            OpenPopup("another popup",0);
          }
          bVar6 = BeginPopup("another popup",0);
          if (bVar6) {
            pbVar21 = (bool *)&ShowDemoWindowPopups()::toggles;
            lVar22 = 0;
            do {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_3f36c_00222cc0 + lVar22),"",pbVar21,true
                      );
              lVar22 = lVar22 + 8;
              pbVar21 = pbVar21 + 1;
            } while (lVar22 != 0x28);
            bVar6 = BeginMenu("Sub-menu",true);
            if (bVar6) {
              MenuItem("Click me",(char *)0x0,false,true);
              local_d8._0_4_ = 0.0;
              local_d8._4_4_ = 0.0;
              bVar6 = Button("Stacked Popup",(ImVec2 *)local_d8);
              if (bVar6) {
                OpenPopup("another popup",0);
              }
              bVar6 = BeginPopup("another popup",0);
              if (bVar6) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar6 = Button("File Menu..",(ImVec2 *)local_d8);
        if (bVar6) {
          OpenPopup("my_file_popup",0);
        }
        bVar6 = BeginPopup("my_file_popup",0);
        if (bVar6) {
          ShowExampleMenuFile();
          EndPopup();
        }
        TreePop();
      }
      bVar6 = TreeNode("Context menus");
      if (bVar6) {
        Text("Value = %.3f (<-- right-click here)",SUB84((double)ShowDemoWindowPopups()::value,0));
        bVar6 = BeginPopupContextItem("item context menu",1);
        if (bVar6) {
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar6 = Selectable("Set to zero",false,0,(ImVec2 *)local_d8);
          if (bVar6) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar6 = Selectable("Set to PI",false,0,(ImVec2 *)local_d8);
          if (bVar6) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.0);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",0);
          EndPopup();
        }
        Text("(You can also right-click me to open the same popup as above.)");
        OpenPopupOnItemClick("item context menu",1);
        sprintf(local_d8,"Button: %s###Button",ShowDemoWindowPopups()::name);
        local_158.x = 0.0;
        local_158.y = 0.0;
        Button(local_d8,&local_158);
        bVar6 = BeginPopupContextItem((char *)0x0,1);
        if (bVar6) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,(ImGuiInputTextCallback)0x0,
                    (void *)0x0);
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar6 = Button("Close",&local_158);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      bVar6 = TreeNode("Modals");
      if (bVar6) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar6 = Button("Delete..",(ImVec2 *)local_d8);
        if (bVar6) {
          OpenPopup("Delete?",0);
        }
        pIVar15 = GetIO();
        local_138._0_4_ = (pIVar15->DisplaySize).x * 0.5;
        pIVar15 = GetIO();
        local_d8._4_4_ = (pIVar15->DisplaySize).y * 0.5;
        local_d8._0_4_ = local_138._0_4_;
        local_158.x = 0.5;
        local_158.y = 0.5;
        SetNextWindowPos((ImVec2 *)local_d8,8,&local_158);
        bVar6 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar6) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          local_158.x = 0.0;
          local_158.y = 0.0;
          PushStyleVar(10,&local_158);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          local_158.x = 120.0;
          local_158.y = 0.0;
          bVar6 = Button("OK",&local_158);
          if (bVar6) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          local_158.x = 120.0;
          local_158.y = 0.0;
          bVar6 = Button("Cancel",&local_158);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        local_158.x = 0.0;
        local_158.y = 0.0;
        bVar6 = Button("Stacked modals..",&local_158);
        if (bVar6) {
          OpenPopup("Stacked 1",0);
        }
        bVar6 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar6) {
          bVar6 = BeginMenuBar();
          if (bVar6) {
            bVar6 = BeginMenu("File",true);
            if (bVar6) {
              MenuItem("Some menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar6 = Button("Add another modal..",&local_158);
          if (bVar6) {
            OpenPopup("Stacked 2",0);
          }
          local_110.x._0_1_ = 1;
          bVar6 = BeginPopupModal("Stacked 2",(bool *)&local_110,0);
          if (bVar6) {
            Text("Hello from Stacked The Second!");
            local_158.x = 0.0;
            local_158.y = 0.0;
            bVar6 = Button("Close",&local_158);
            if (bVar6) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar6 = Button("Close",&local_158);
          if (bVar6) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      bVar6 = TreeNode("Menus inside a regular window");
      if (bVar6) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar6 = BeginMenu("Menu inside a regular window",true);
        if (bVar6) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    ShowDemoWindowTables();
    bVar6 = CollapsingHeader("Filtering",0);
    if (bVar6) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar20 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar20 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      lVar22 = 0;
      do {
        bVar6 = ImGuiTextFilter::PassFilter
                          ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                           *(char **)((long)&PTR_anon_var_dwarf_4591e_00222f60 + lVar22),(char *)0x0
                          );
        if (bVar6) {
          BulletText("%s");
        }
        lVar22 = lVar22 + 8;
      } while (lVar22 != 0x40);
    }
    bVar6 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar6) {
      pIVar15 = GetIO();
      Text("WantCaptureMouse: %d",(ulong)pIVar15->WantCaptureMouse);
      Text("WantCaptureKeyboard: %d",(ulong)pIVar15->WantCaptureKeyboard);
      Text("WantTextInput: %d",(ulong)pIVar15->WantTextInput);
      Text("WantSetMousePos: %d",(ulong)pIVar15->WantSetMousePos);
      Text("NavActive: %d, NavVisible: %d",(ulong)pIVar15->NavActive,(ulong)pIVar15->NavVisible);
      bVar6 = TreeNode("Keyboard, Mouse & Navigation State");
      if (bVar6) {
        bVar6 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar6) {
          Text("Mouse pos: (%g, %g)",SUB84((double)(pIVar15->MousePos).x,0),
               SUB84((double)(pIVar15->MousePos).y,0));
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",SUB84((double)(pIVar15->MouseDelta).x,0));
        lVar22 = 0;
        Text("Mouse down:");
        do {
          if (0.0 <= pIVar15->MouseDownDuration[lVar22]) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",SUB84((double)pIVar15->MouseDownDuration[lVar22],0));
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 5);
        Text("Mouse clicked:");
        iVar20 = 0;
        do {
          bVar6 = IsMouseClicked(iVar20,false);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("b%d");
          }
          iVar20 = iVar20 + 1;
        } while (iVar20 != 5);
        Text("Mouse dblclick:");
        uVar9 = 0;
        do {
          bVar6 = IsMouseDoubleClicked(uVar9);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar9);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != 5);
        Text("Mouse released:");
        uVar9 = 0;
        do {
          bVar6 = IsMouseReleased(uVar9);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("b%d",(ulong)uVar9);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != 5);
        Text("Mouse wheel: %.1f",SUB84((double)pIVar15->MouseWheel,0));
        uVar27 = 0;
        Text("Keys down:");
        do {
          if (0.0 <= pIVar15->KeysDownDuration[uVar27]) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X) (%.02f secs)",SUB84((double)pIVar15->KeysDownDuration[uVar27],0),
                 uVar27 & 0xffffffff,uVar27 & 0xffffffff);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != 0x200);
        Text("Keys pressed:");
        uVar9 = 0;
        do {
          bVar6 = IsKeyPressed(uVar9,true);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",(ulong)uVar9,(ulong)uVar9);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x200);
        Text("Keys release:");
        uVar27 = 0;
        do {
          bVar6 = IsKeyReleased((int)uVar27);
          if (bVar6) {
            SameLine(0.0,-1.0);
            Text("%d (0x%X)",uVar27,uVar27);
          }
          uVar9 = (int)uVar27 + 1;
          uVar27 = (ulong)uVar9;
        } while (uVar9 != 0x200);
        pcVar24 = "CTRL ";
        if (pIVar15->KeyCtrl == false) {
          pcVar24 = "";
        }
        pcVar23 = "SHIFT ";
        if (pIVar15->KeyShift == false) {
          pcVar23 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar24,pcVar23);
        Text("Chars queue:");
        if (0 < (pIVar15->InputQueueCharacters).Size) {
          lVar22 = 0;
          do {
            uVar2 = (pIVar15->InputQueueCharacters).Data[lVar22];
            SameLine(0.0,-1.0);
            uVar9 = (int)(char)uVar2;
            if (0xde < (ushort)(uVar2 - 0x21)) {
              uVar9 = 0x3f;
            }
            Text("\'%c\' (0x%04X)",(ulong)uVar9,(ulong)uVar2);
            lVar22 = lVar22 + 1;
          } while (lVar22 < (pIVar15->InputQueueCharacters).Size);
        }
        uVar27 = 0;
        Text("NavInputs down:");
        do {
          if (0.0 < pIVar15->NavInputs[uVar27]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",SUB84((double)pIVar15->NavInputs[uVar27],0),uVar27 & 0xffffffff);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != 0x15);
        Text("NavInputs pressed:");
        uVar27 = 0;
        do {
          if ((pIVar15->NavInputsDownDuration[uVar27] == 0.0) &&
             (!NAN(pIVar15->NavInputsDownDuration[uVar27]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar27 & 0xffffffff);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != 0x15);
        uVar27 = 0;
        Text("NavInputs duration:");
        do {
          if (0.0 <= pIVar15->NavInputsDownDuration[uVar27]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f",SUB84((double)pIVar15->NavInputsDownDuration[uVar27],0),
                 uVar27 & 0xffffffff);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != 0x15);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)local_d8);
        bVar6 = IsItemHovered(0);
        if (bVar6) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)local_d8);
        bVar6 = IsItemActive();
        if (bVar6) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      bVar6 = TreeNode("Tabbing");
      if (bVar6) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      bVar6 = TreeNode("Focus from code");
      if (bVar6) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar6 = Button("Focus on 1",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar7 = Button("Focus on 2",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar8 = Button("Focus on 3",(ImVec2 *)local_d8);
        if (bVar6) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar6 = IsItemActive();
        uVar9 = (uint)bVar6;
        if (bVar7) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar6 = IsItemActive();
        if (bVar6) {
          uVar9 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar8) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        bVar6 = IsItemActive();
        if (bVar6) {
          uVar9 = 3;
        }
        PopAllowKeyboardFocus();
        if (uVar9 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar9);
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar6 = Button("Focus on X",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar7 = Button("Focus on Y",(ImVec2 *)local_d8);
        iVar20 = 1;
        if (!bVar7) {
          iVar20 = bVar6 - 1;
        }
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar6 = Button("Focus on Z",(ImVec2 *)local_d8);
        iVar25 = 2;
        if (!bVar6) {
          iVar25 = iVar20;
        }
        if (iVar25 != -1) {
          SetKeyboardFocusHere(iVar25);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      bVar6 = TreeNode("Dragging");
      if (bVar6) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        uVar9 = 0;
        do {
          Text("IsMouseDragging(%d):",(ulong)uVar9);
          bVar6 = IsMouseDragging(uVar9,-1.0);
          Text("  w/ default threshold: %d,",(ulong)bVar6);
          bVar6 = IsMouseDragging(uVar9,0.0);
          Text("  w/ zero threshold: %d,",(ulong)bVar6);
          bVar6 = IsMouseDragging(uVar9,20.0);
          Text("  w/ large threshold: %d,",(ulong)bVar6);
          uVar9 = uVar9 + 1;
        } while (uVar9 != 3);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Drag Me",(ImVec2 *)local_d8);
        bVar6 = IsItemActive();
        if (bVar6) {
          pIVar16 = GetForegroundDrawList();
          IVar10 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar16,pIVar15->MouseClickedPos,&pIVar15->MousePos,IVar10,4.0);
        }
        IVar4 = GetMouseDragDelta(0,0.0);
        local_108._8_4_ = extraout_XMM0_Dc_03;
        local_108._0_4_ = IVar4.x;
        local_108._4_4_ = IVar4.y;
        local_108._12_4_ = extraout_XMM0_Dd_03;
        IVar4 = GetMouseDragDelta(0,-1.0);
        uStack_40 = extraout_XMM0_Dc_04;
        local_48._0_4_ = IVar4.x;
        local_48._4_4_ = IVar4.y;
        uStack_3c = extraout_XMM0_Dd_04;
        local_138 = (undefined1  [8])(double)(pIVar15->MouseDelta).x;
        local_128._0_8_ = (double)(pIVar15->MouseDelta).y;
        Text("GetMouseDragDelta(0):");
        Text("  w/ default threshold: (%.1f, %.1f)",SUB84((double)(float)local_48._0_4_,0),
             SUB84((double)(float)local_48._4_4_,0));
        Text("  w/ zero threshold: (%.1f, %.1f)",SUB84((double)(float)local_108._0_4_,0),
             SUB84((double)(float)local_108._4_4_,0));
        Text("io.MouseDelta: (%.1f, %.1f)",local_138._0_4_,local_128._0_4_);
        TreePop();
      }
      bVar6 = TreeNode("Mouse cursors");
      if (bVar6) {
        IVar12 = GetMouseCursor();
        puVar26 = &DAT_00222fa0;
        Text("Current mouse cursor = %d: %s",(long)IVar12,(&DAT_00222fa0)[IVar12]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        uVar27 = 0;
        do {
          sprintf(local_d8,"Mouse cursor %d: %s",uVar27 & 0xffffffff,*puVar26);
          Bullet();
          local_158.x = 0.0;
          local_158.y = 0.0;
          Selectable(local_d8,false,0,&local_158);
          bVar6 = IsItemHovered(0);
          if (bVar6) {
            SetMouseCursor((ImGuiMouseCursor)uVar27);
          }
          uVar27 = uVar27 + 1;
          puVar26 = puVar26 + 1;
        } while (uVar27 != 9);
        TreePop();
      }
    }
    PopItemWidth();
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    // Exceptionally add an extra assert here for people confused about initial Dear ImGui setup
    // Most ImGui functions would normally just crash if the context is missing.
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!");

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_main_menu_bar = false;
    static bool show_app_documents = false;
    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);

    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)       { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_about)         { ImGui::ShowAboutWindow(&show_app_about); }
    if (show_app_style_editor)
    {
        ImGui::Begin("Dear ImGui Style Editor", &show_app_style_editor);
        ImGui::ShowStyleEditor();
        ImGui::End();
    }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file.
    // We only do it to make the demo applications a little more welcoming, but typically this isn't required.
    ImGui::SetNextWindowPos(ImVec2(650, 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default. See 'Demo->Layout->Widgets Width' for details.

    // e.g. Use 2/3 of the space for widgets and 1/3 for labels (right align)
    //ImGui::PushItemWidth(-ImGui::GetWindowWidth() * 0.35f);

    // e.g. Leave a fixed amount of width for labels (by passing a negative value), the rest goes to widgets.
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Tools"))
        {
            ImGui::MenuItem("Metrics/Debugger", NULL, &show_app_metrics);
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("ABOUT THIS DEMO:");
        ImGui::BulletText("Sections below are demonstrating many aspects of the library.");
        ImGui::BulletText("The \"Examples\" menu above leads to more demo contents.");
        ImGui::BulletText("The \"Tools\" menu above gives access to: About Box, Style Editor,\n"
                          "and Metrics/Debugger (general purpose Dear ImGui debugging tool).");
        ImGui::Separator();

        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("See comments in imgui.cpp.");
        ImGui::BulletText("See example applications in the examples/ folder.");
        ImGui::BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",    &io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::SameLine(); HelpMarker("Enable keyboard controls.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad",     &io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", &io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse",              &io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
            {
                // The "NoMouse" option can get us stuck with a disabled mouse! Let's provide an alternative way to fix it:
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_Space)))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", &io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting)");
            ImGui::Checkbox("io.ConfigDragClickToInputText", &io.ConfigDragClickToInputText);
            ImGui::SameLine(); HelpMarker("Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving).");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::Text("Also see Style->Rendering for rendering options.");
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker(
                "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\n"
                "Here we expose then as read-only fields to avoid breaking interactions with your backend.");

            // Make a local copy to avoid modifying actual backend flags.
            ImGuiBackendFlags backend_flags = io.BackendFlags;
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad",           &backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors",      &backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos",       &backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", &backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Style"))
        {
            HelpMarker("The same contents can be accessed in 'Tools->Style Editor' or by calling the ShowStyleEditor() function.");
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        if (ImGui::TreeNode("Capture/Logging"))
        {
            HelpMarker(
                "The logging API redirects all text output so you can easily capture the content of "
                "a window or a block. Tree nodes can be automatically expanded.\n"
                "Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();

            HelpMarker("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    if (ImGui::CollapsingHeader("Window options"))
    {
        if (ImGui::BeginTable("split", 3))
        {
            ImGui::TableNextColumn(); ImGui::Checkbox("No titlebar", &no_titlebar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No scrollbar", &no_scrollbar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No menu", &no_menu);
            ImGui::TableNextColumn(); ImGui::Checkbox("No move", &no_move);
            ImGui::TableNextColumn(); ImGui::Checkbox("No resize", &no_resize);
            ImGui::TableNextColumn(); ImGui::Checkbox("No collapse", &no_collapse);
            ImGui::TableNextColumn(); ImGui::Checkbox("No close", &no_close);
            ImGui::TableNextColumn(); ImGui::Checkbox("No nav", &no_nav);
            ImGui::TableNextColumn(); ImGui::Checkbox("No background", &no_background);
            ImGui::TableNextColumn(); ImGui::Checkbox("No bring to front", &no_bring_to_front);
            ImGui::EndTable();
        }
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::PopItemWidth();
    ImGui::End();
}